

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffverifydate(int year,int month,int day,int *status)

{
  ulong uVar1;
  char *pcVar2;
  char errmsg [81];
  
  uVar1 = (ulong)(uint)year;
  if ((uint)year < 10000) {
    uVar1 = (ulong)(uint)month;
    if (0xfffffff3 < month - 0xdU) {
      if ((0x15aaUL >> (uVar1 & 0x3f) & 1) == 0) {
        if ((0xa50UL >> (uVar1 & 0x3f) & 1) == 0) {
          if (0xffffffe3 < day - 0x1dU) {
LAB_001e738f:
            return *status;
          }
          if (day == 0x1d) {
            if (((short)((year & 0xffffU) % 400) == 0) ||
               ((year & 3U) == 0 && (ushort)((ushort)year % 100) != 0)) goto LAB_001e738f;
            snprintf(errmsg,0x51,
                     "input day value = %d is out of range 1 - 28 for February %d (not leap year)",
                     0x1d);
          }
          else {
            snprintf(errmsg,0x51,"input day value = %d is out of range 1 - 28 (or 29) for February")
            ;
          }
          goto LAB_001e72c9;
        }
        if (0xffffffe1 < day - 0x1fU) goto LAB_001e738f;
        pcVar2 = "input day value = %d is out of range 1 - 30 for month %d";
      }
      else {
        if (0xffffffe0 < day - 0x20U) goto LAB_001e738f;
        pcVar2 = "input day value = %d is out of range 1 - 31 for month %d";
      }
      snprintf(errmsg,0x51,pcVar2,day,uVar1);
      goto LAB_001e72c9;
    }
    pcVar2 = "input month value = %d is out of range 1 - 12";
  }
  else {
    pcVar2 = "input year value = %d is out of range 0 - 9999";
  }
  snprintf(errmsg,0x51,pcVar2,uVar1);
LAB_001e72c9:
  ffpmsg(errmsg);
  *status = 0x1a4;
  return 0x1a4;
}

Assistant:

int ffverifydate(int year,          /* I - year (0 - 9999)           */
                 int month,         /* I - month (1 - 12)            */
                 int day,           /* I - day (1 - 31)              */
                 int   *status)     /* IO - error status             */
/*
  Verify that the date is valid
*/
{
    int ndays[] = {0,31,28,31,30,31,30,31,31,30,31,30,31};
    char errmsg[FLEN_ERRMSG];
    

    if (year < 0 || year > 9999)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input year value = %d is out of range 0 - 9999", year);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    else if (month < 1 || month > 12)
    {
       snprintf(errmsg, FLEN_ERRMSG,
       "input month value = %d is out of range 1 - 12", month);
       ffpmsg(errmsg);
       return(*status = BAD_DATE);
    }
    
    if (ndays[month] == 31) {
        if (day < 1 || day > 31)
        {
           snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 31 for month %d", day, month);
           ffpmsg(errmsg);
           return(*status = BAD_DATE);
        }
    } else if (ndays[month] == 30) {
        if (day < 1 || day > 30)
        {
           snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 30 for month %d", day, month);
           ffpmsg(errmsg);
           return(*status = BAD_DATE);
        }
    } else {
        if (day < 1 || day > 28)
        {
            if (day == 29)
            {
	      /* year is a leap year if it is divisible by 4 but not by 100,
	         except years divisible by 400 are leap years
	      */
	        if ((year % 4 == 0 && year % 100 != 0 ) || year % 400 == 0)
		   return (*status);
		   
 	        snprintf(errmsg, FLEN_ERRMSG,
           "input day value = %d is out of range 1 - 28 for February %d (not leap year)", day, year);
                ffpmsg(errmsg);
	    } else {
                snprintf(errmsg, FLEN_ERRMSG,
                "input day value = %d is out of range 1 - 28 (or 29) for February", day);
                ffpmsg(errmsg);
	    }
	    
            return(*status = BAD_DATE);
        }
    }
    return(*status);
}